

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
* __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator::operator()
          (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *__return_storage_ptr__,DepsGenerator *this,Descriptor *desc)

{
  long lVar1;
  string *psVar2;
  long lVar3;
  Descriptor *local_40;
  LogMessageFatal local_38 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(desc + 4)) {
    lVar3 = 0;
    do {
      lVar1 = google::protobuf::FieldDescriptor::message_type();
      if (lVar1 != 0) {
        if (*(int *)(desc + 4) <= lVar3) {
          psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar3,(long)*(int *)(desc + 4),"index < field_count()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_38,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0x9f4,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
        }
        local_40 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::emplace_back<google::protobuf::Descriptor_const*>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)__return_storage_ptr__,&local_40);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(desc + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Descriptor*> operator()(const Descriptor* desc) const {
      std::vector<const Descriptor*> deps;
      for (int i = 0; i < desc->field_count(); i++) {
        if (desc->field(i)->message_type()) {
          deps.push_back(desc->field(i)->message_type());
        }
      }
      return deps;
    }